

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool ON_GetCageXform(ON_NurbsCage *cage,ON_Xform *cage_xform)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  ON_Xform *pOVar5;
  double *pdVar6;
  bool bVar7;
  byte bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ON_Interval d0;
  ON_3dPoint P000;
  ON_3dVector X0;
  ON_3dPoint P001;
  ON_3dPoint P010;
  ON_3dPoint P100;
  ON_Interval d2;
  ON_Interval d1;
  ON_3dVector Z0;
  ON_3dVector Y0;
  ON_Xform x1;
  ON_Xform local_230;
  ON_Xform local_1b0;
  ON_Xform x3;
  ON_Xform x2;
  
  bVar8 = 0;
  pdVar3 = (double *)&ON_Xform::IdentityTransformation;
  pdVar6 = (double *)cage_xform;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pdVar6 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar6 = pdVar6 + 1;
  }
  bVar7 = false;
  iVar2 = (*(cage->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(cage);
  if ((char)iVar2 != '\0') {
    bVar7 = false;
    bVar1 = ON_NurbsCage::GetCV(cage,0,0,0,&P000);
    if (bVar1) {
      bVar7 = false;
      bVar1 = ON_NurbsCage::GetCV(cage,cage->m_cv_count[0] + -1,0,0,&P100);
      if (bVar1) {
        bVar7 = false;
        bVar1 = ON_NurbsCage::GetCV(cage,0,cage->m_cv_count[1] + -1,0,&P010);
        if (bVar1) {
          bVar7 = false;
          bVar1 = ON_NurbsCage::GetCV(cage,0,0,cage->m_cv_count[2] + -1,&P001);
          if (bVar1) {
            ON_3dPoint::operator-(&X0,&P100,&P000);
            ON_3dPoint::operator-(&Y0,&P010,&P000);
            ON_3dPoint::operator-(&Z0,&P001,&P000);
            dVar9 = ON_3dVector::Length(&X0);
            dVar10 = ON_3dVector::Length(&Y0);
            dVar11 = ON_3dVector::Length(&Z0);
            d0 = ON_NurbsCage::Domain(cage,0);
            d1 = ON_NurbsCage::Domain(cage,1);
            d2 = ON_NurbsCage::Domain(cage,2);
            ON_3dVector::Unitize(&X0);
            ON_3dVector::Unitize(&Y0);
            ON_3dVector::Unitize(&Z0);
            ON_Xform::ON_Xform(&x1);
            ON_Xform::Rotation(&x1,&P000,&X0,&Y0,&Z0,&ON_3dPoint::Origin,&ON_3dVector::XAxis,
                               &ON_3dVector::YAxis,&ON_3dVector::ZAxis);
            dVar12 = ON_Interval::Length(&d0);
            dVar13 = ON_Interval::Length(&d1);
            dVar14 = ON_Interval::Length(&d2);
            ON_Xform::DiagonalTransformation(&x2,dVar12 / dVar9,dVar13 / dVar10,dVar14 / dVar11);
            pdVar3 = ON_Interval::operator[](&d0,0);
            dVar9 = *pdVar3;
            pdVar3 = ON_Interval::operator[](&d1,0);
            dVar10 = *pdVar3;
            pdVar3 = ON_Interval::operator[](&d2,0);
            ON_Xform::TranslationTransformation(&x3,dVar9,dVar10,*pdVar3);
            ON_Xform::operator*(&local_230,&x2,&x1);
            ON_Xform::operator*(&local_1b0,&x3,&local_230);
            pOVar5 = &local_1b0;
            for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
              cage_xform->m_xform[0][0] = pOVar5->m_xform[0][0];
              pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar8 * -2 + 1) * 8);
              cage_xform = (ON_Xform *)((long)cage_xform + ((ulong)bVar8 * -2 + 1) * 8);
            }
            bVar7 = true;
          }
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool ON_GetCageXform( const ON_NurbsCage& cage, ON_Xform& cage_xform )
{
  bool rc = false;
  cage_xform = ON_Xform::IdentityTransformation;
  if ( cage.IsValid() )
  {
    ON_3dPoint P000, P100, P010, P001;
    if ( !cage.GetCV(0,0,0,P000) )
      return false;
    if ( !cage.GetCV(cage.CVCount(0)-1,0,0,P100))
      return false;
    if (!cage.GetCV(0,cage.CVCount(1)-1,0,P010))
      return false;
    if (!cage.GetCV(0,0,cage.CVCount(2)-1,P001))
      return false;

    ON_3dVector X0 = P100 - P000;
    ON_3dVector Y0 = P010 - P000;
    ON_3dVector Z0 = P001 - P000;

    double dx0 = X0.Length();
    double dy0 = Y0.Length();
    double dz0 = Z0.Length();

    ON_Interval d0 = cage.Domain(0);
    ON_Interval d1 = cage.Domain(1);
    ON_Interval d2 = cage.Domain(2);

    X0.Unitize();
    Y0.Unitize();
    Z0.Unitize();

    ON_Xform x1;
    x1.Rotation( 
      P000, X0, Y0, Z0, 
      ON_3dPoint::Origin, ON_3dVector::XAxis, ON_3dVector::YAxis, ON_3dVector::ZAxis 
      );

    const ON_Xform x2(ON_Xform::DiagonalTransformation( d0.Length()/dx0, d1.Length()/dy0, d2.Length()/dz0 ));
      
    const ON_Xform x3(ON_Xform::TranslationTransformation( d0[0],d1[0],d2[0]));


    cage_xform = x3*(x2*x1);
    rc = true;
  }
  return rc;
}